

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O2

void dlib::blas_bindings::
     matrix_assign_blas_helper<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>,void>
     ::
     assign<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
               *src,type alpha,bool add_to,bool transpose)

{
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> local_50;
  matrix_type temp;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> local_28;
  
  if ((alpha != 1.0) || (NAN(alpha))) {
    if (add_to) {
      matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
      matrix(&temp,dest->height,dest->width);
      zero_matrix<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                (&temp);
      if (transpose) {
        local_50.op.m = (op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>)src->rhs;
        local_28.op.m = (op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>)src->lhs;
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  (&temp,&local_50,&local_28);
      }
      else {
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                  (&temp,src->lhs,src->rhs);
      }
      matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                (dest,&temp,alpha,true);
      row_major_layout::layout<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::
      ~layout(&temp.data);
    }
    else {
      zero_matrix<dlib::assignable_ptr_matrix<float>>(dest);
      if (transpose) {
        temp.data.data = (float *)src->rhs;
        local_50.op.m = (op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>)src->lhs;
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                  (dest,(matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
                         *)&temp,&local_50);
      }
      else {
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                  (dest,src->lhs,src->rhs);
      }
      matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::assignable_ptr_matrix<float>>
                (dest,dest,alpha,false);
    }
  }
  else {
    if (!add_to) {
      zero_matrix<dlib::assignable_ptr_matrix<float>>(dest);
    }
    if (!transpose) {
      default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                (dest,src->lhs,src->rhs);
      return;
    }
    temp.data.data = (float *)src->rhs;
    local_50.op.m = (op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>)src->lhs;
    default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
              (dest,(matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> *
                    )&temp,&local_50);
  }
  return;
}

Assistant:

static void assign (
                dest_exp& dest,
                const matrix_multiply_exp<EXP1,EXP2>& src,
                typename src_exp::type alpha,
                bool add_to,
                bool transpose
            )
            {
                // At some point I need to improve the default (i.e. non BLAS) matrix 
                // multiplication algorithm...

                if (alpha == static_cast<typename src_exp::type>(1))
                {
                    if (add_to == false)
                    {
                        zero_matrix(dest);
                    }

                    if (transpose == false)
                        default_matrix_multiply(dest, src.lhs, src.rhs);
                    else
                        default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));
                }
                else
                {
                    if (add_to)
                    {
                        typename dest_exp::matrix_type temp(dest.nr(),dest.nc());
                        zero_matrix(temp);

                        if (transpose == false)
                            default_matrix_multiply(temp, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(temp, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,temp, alpha,true);
                    }
                    else
                    {
                        zero_matrix(dest);
                        
                        if (transpose == false)
                            default_matrix_multiply(dest, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,dest, alpha, false);
                    }
                }
            }